

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimePolymorphicInlineCacheInfo.cpp
# Opt level: O2

void JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo
               (Recycler *recycler,EntryPointPolymorphicInlineCacheInfo *runtimeInfo,
               CodeGenWorkItemIDL *jitInfo)

{
  uint uVar1;
  code *pcVar2;
  undefined1 auVar3 [8];
  undefined4 *puVar4;
  bool bVar5;
  Recycler *pRVar6;
  PolymorphicInlineCacheInfoIDL *jitInfo_00;
  Type *pTVar7;
  type_info *this;
  ulong uVar8;
  undefined1 local_90 [8];
  TrackAllocData data;
  SListNodeBase<Memory::Recycler> local_48;
  PolymorphicInlineCacheInfoIDL *local_40;
  undefined4 *local_38;
  
  if (runtimeInfo != (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    local_90 = (undefined1  [8])&PolymorphicInlineCacheInfoIDL::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    this = (type_info *)&runtimeInfo->inlineeInfo;
    data.count = (size_t)anon_var_dwarf_17aee8a;
    data.filename._0_4_ = 0x1a;
    data._32_8_ = jitInfo;
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_90);
    uVar8 = 0;
    jitInfo_00 = (PolymorphicInlineCacheInfoIDL *)new<Memory::Recycler>(0x20,pRVar6,0x51e21e);
    (jitInfo_00->polymorphicCacheUtilizationArray).ptr = (uchar *)0x0;
    (jitInfo_00->polymorphicInlineCaches).ptr = (PolymorphicInlineCacheIDL *)0x0;
    (jitInfo_00->functionBodyAddr).ptr = (void *)0x0;
    InitializePolymorphicInlineCacheInfo(recycler,&runtimeInfo->selfInfo,jitInfo_00);
    bVar5 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Empty
                      ((SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                       this);
    local_40 = (PolymorphicInlineCacheInfoIDL *)0x0;
    if (!bVar5) {
      uVar1 = (runtimeInfo->inlineeInfo).
              super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
              super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
              super_RealCount.count;
      local_90 = (undefined1  [8])&PolymorphicInlineCacheInfoIDL::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_17aee8a;
      data.filename._0_4_ = 0x22;
      data.plusSize = (ulong)uVar1;
      pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_90);
      local_40 = Memory::AllocateArray<Memory::Recycler,PolymorphicInlineCacheInfoIDL,false>
                           ((Memory *)pRVar6,(Recycler *)Memory::Recycler::Alloc,0,(ulong)uVar1);
      local_90 = (undefined1  [8])this;
      data.typeinfo = this;
      local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        if (this == (type_info *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = local_38;
          *local_38 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_0051e00d;
          *puVar4 = 0;
        }
        auVar3 = local_90;
        SListNodeBase<Memory::Recycler>::Next(&local_48);
        if (local_48.next.ptr == (Type)auVar3) break;
        SListNodeBase<Memory::Recycler>::Next(&local_48);
        data.typeinfo = (type_info *)local_48.next.ptr;
        pTVar7 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator
                 ::Data((Iterator *)local_90);
        InitializePolymorphicInlineCacheInfo(recycler,pTVar7->ptr,local_40 + uVar8);
        uVar8 = (ulong)((uint)uVar8 + 1);
        this = data.typeinfo;
      }
      data.typeinfo = (type_info *)0x0;
      if (uVar1 != (uint)uVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = local_38;
        *local_38 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimePolymorphicInlineCacheInfo.cpp"
                           ,0x2c,"(i == inlineeCount)","i == inlineeCount");
        if (!bVar5) {
LAB_0051e00d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
    *(Type *)(data._32_8_ + 0xc) =
         (runtimeInfo->inlineeInfo).
         super_SList<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
         super_SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>.
         super_RealCount.count;
    *(PolymorphicInlineCacheInfoIDL **)(data._32_8_ + 0x18) = jitInfo_00;
    *(PolymorphicInlineCacheInfoIDL **)(data._32_8_ + 0x20) = local_40;
  }
  return;
}

Assistant:

void
JITTimePolymorphicInlineCacheInfo::InitializeEntryPointPolymorphicInlineCacheInfo(
    __in Recycler * recycler,
    __in Js::EntryPointPolymorphicInlineCacheInfo * runtimeInfo,
    __out CodeGenWorkItemIDL * jitInfo)
{
    if (runtimeInfo == nullptr)
    {
        return;
    }
    Js::PolymorphicInlineCacheInfo * selfInfo = runtimeInfo->GetSelfInfo();
    SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler> * inlineeList = runtimeInfo->GetInlineeInfo();
    PolymorphicInlineCacheInfoIDL* selfInfoIDL = RecyclerNewStructZ(recycler, PolymorphicInlineCacheInfoIDL);
    PolymorphicInlineCacheInfoIDL* inlineeInfoIDL = nullptr;

    JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, selfInfo, selfInfoIDL);
    
    if (!inlineeList->Empty())
    {
        const uint inlineeCount = inlineeList->Count();
        inlineeInfoIDL = RecyclerNewArray(recycler, PolymorphicInlineCacheInfoIDL, inlineeCount);
        SListCounted<Js::PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(inlineeList);
        uint i = 0;
        while (iter.Next())
        {
            Js::PolymorphicInlineCacheInfo * inlineeInfo = iter.Data();
            __analysis_assume(i < inlineeCount);
            JITTimePolymorphicInlineCacheInfo::InitializePolymorphicInlineCacheInfo(recycler, inlineeInfo, &inlineeInfoIDL[i]);
            ++i;
        }
        Assert(i == inlineeCount);
    }
    jitInfo->inlineeInfoCount = inlineeList->Count();
    jitInfo->selfInfo = selfInfoIDL;
    jitInfo->inlineeInfo = inlineeInfoIDL;
}